

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O3

void __thiscall OpenMD::Velocitizer::randomize(Velocitizer *this,RealType temperature)

{
  undefined4 *puVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  SimInfo *this_00;
  StuntDouble *pSVar6;
  result_type_conflict1 rVar7;
  int iVar8;
  Molecule *pMVar9;
  long lVar10;
  ulong uVar11;
  pointer ppSVar12;
  double dVar13;
  double dVar14;
  Vector3d j;
  MoleculeIterator mi;
  Vector3d v;
  Mat3x3d I;
  double local_d8 [3];
  MoleculeIterator local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  normal_distribution<double> local_98;
  double local_78 [9];
  
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  local_d8[2] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_78[8] = 0.0;
  local_78[6] = 0.0;
  local_78[7] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_c0._M_node = (_Base_ptr)0x0;
  local_98._M_param._M_mean._0_4_ = 0;
  local_98._M_param._M_mean._4_4_ = 0;
  local_98._M_param._M_stddev._0_4_ = 0;
  local_98._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_98._M_saved = 0.0;
  local_98._M_saved_available = false;
  this_00 = this->info_;
  iVar3 = this_00->ndf_;
  iVar4 = this_00->ndfRaw_;
  iVar8 = SimInfo::getFdf(this_00);
  pMVar9 = SimInfo::beginMolecule(this->info_,&local_c0);
  if (pMVar9 != (Molecule *)0x0) {
    dVar13 = (double)(iVar3 - iVar8);
    dVar13 = ((double)iVar4 * temperature * 8.31451e-07) / (dVar13 + dVar13);
    dVar13 = dVar13 + dVar13;
    do {
      ppSVar12 = (pMVar9->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar12 !=
          (pMVar9->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar6 = *ppSVar12;
        while (pSVar6 != (StuntDouble *)0x0) {
          dVar14 = dVar13 / pSVar6->mass_;
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          lVar10 = 0;
          do {
            rVar7 = std::normal_distribution<double>::operator()
                              (&local_98,
                               (this->randNumGen_).
                               super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_98._M_param);
            (&local_b8)[lVar10] = rVar7 * dVar14;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          iVar3 = pSVar6->localIndex_;
          lVar10 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
          *(undefined8 *)(lVar10 + 0x10 + (long)iVar3 * 0x18) = local_a8;
          puVar1 = (undefined4 *)(lVar10 + (long)iVar3 * 0x18);
          *puVar1 = (undefined4)local_b8;
          puVar1[1] = local_b8._4_4_;
          puVar1[2] = (undefined4)uStack_b0;
          puVar1[3] = uStack_b0._4_4_;
          if (pSVar6->objType_ - otDAtom < 2) {
            (*pSVar6->_vptr_StuntDouble[5])(local_78,pSVar6);
            if (pSVar6->linear_ == false) {
              lVar10 = 0;
              do {
                dVar14 = *(double *)((long)local_78 + lVar10 * 4) * dVar13;
                if (dVar14 < 0.0) {
                  dVar14 = sqrt(dVar14);
                }
                else {
                  dVar14 = SQRT(dVar14);
                }
                rVar7 = std::normal_distribution<double>::operator()
                                  (&local_98,
                                   (this->randNumGen_).
                                   super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,&local_98._M_param);
                *(double *)((long)local_d8 + lVar10) = rVar7 * dVar14;
                lVar10 = lVar10 + 8;
              } while (lVar10 != 0x18);
            }
            else {
              uVar5 = pSVar6->linearAxis_;
              uVar11 = (ulong)(((int)(uVar5 + 1) / 3) * -3 + uVar5 + 1);
              local_d8[uVar5] = 0.0;
              dVar14 = local_78[uVar11 * 4] * dVar13;
              if (dVar14 < 0.0) {
                dVar14 = sqrt(dVar14);
              }
              else {
                dVar14 = SQRT(dVar14);
              }
              rVar7 = std::normal_distribution<double>::operator()
                                (&local_98,
                                 (this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&local_98._M_param);
              local_d8[uVar11] = rVar7 * dVar14;
              uVar11 = (ulong)(uVar5 + ((int)(uVar5 + 2) / 3) * -3 + 2);
              dVar14 = local_78[uVar11 * 4] * dVar13;
              if (dVar14 < 0.0) {
                dVar14 = sqrt(dVar14);
              }
              else {
                dVar14 = SQRT(dVar14);
              }
              rVar7 = std::normal_distribution<double>::operator()
                                (&local_98,
                                 (this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&local_98._M_param);
              local_d8[uVar11] = rVar7 * dVar14;
            }
            iVar3 = pSVar6->localIndex_;
            lVar10 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                      angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
            *(double *)(lVar10 + 0x10 + (long)iVar3 * 0x18) = local_d8[2];
            pdVar2 = (double *)(lVar10 + (long)iVar3 * 0x18);
            *pdVar2 = local_d8[0];
            pdVar2[1] = local_d8[1];
          }
          ppSVar12 = ppSVar12 + 1;
          if (ppSVar12 ==
              (pMVar9->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) break;
          pSVar6 = *ppSVar12;
        }
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_c0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::randomize(RealType temperature) {
    Vector3d v;
    Vector3d j;
    Mat3x3d I;
    int l, m, n;
    Vector3d vdrift;
    RealType vbar;
    RealType jbar;
    RealType av2;
    RealType kebar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    kebar = Constants::kB * temperature * info_->getNdfRaw() /
            (2.0 * info_->getNdf());
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        // uses equipartition theory to solve for vbar in angstrom/fs

        av2  = 2.0 * kebar / sd->getMass();
        vbar = sqrt(av2);

        // picks random velocities from a gaussian distribution
        // centered on vbar

        for (int k = 0; k < 3; k++) {
          v[k] = vbar * normalDistribution(*randNumGen_);
        }
        sd->setVel(v);

        if (sd->isDirectional()) {
          I = sd->getI();

          if (sd->isLinear()) {
            l = sd->linearAxis();
            m = (l + 1) % 3;
            n = (l + 2) % 3;

            j[l] = 0.0;
            jbar = sqrt(2.0 * kebar * I(m, m));
            j[m] = jbar * normalDistribution(*randNumGen_);
            jbar = sqrt(2.0 * kebar * I(n, n));
            j[n] = jbar * normalDistribution(*randNumGen_);
          } else {
            for (int k = 0; k < 3; k++) {
              jbar = sqrt(2.0 * kebar * I(k, k));
              j[k] = jbar * normalDistribution(*randNumGen_);
            }
          }

          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }